

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O3

status_t tchecker::dbm::constrain
                   (db_t *dbm,clock_id_t dim,clock_constraint_container_t *constraints)

{
  pointer pcVar1;
  bool bVar2;
  status_t sVar3;
  clock_constraint_t *c;
  pointer c_00;
  
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x107,
                  "enum tchecker::dbm::status_t tchecker::dbm::constrain(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::clock_constraint_container_t &)"
                 );
  }
  if (dim == 0) {
    __assert_fail("dim >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x108,
                  "enum tchecker::dbm::status_t tchecker::dbm::constrain(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::clock_constraint_container_t &)"
                 );
  }
  bVar2 = is_consistent(dbm,dim);
  if (!bVar2) {
    __assert_fail("tchecker::dbm::is_consistent(dbm, dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x109,
                  "enum tchecker::dbm::status_t tchecker::dbm::constrain(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::clock_constraint_container_t &)"
                 );
  }
  bVar2 = is_tight(dbm,dim);
  if (bVar2) {
    c_00 = (constraints->
           super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
           )._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (constraints->
             super__Vector_base<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (c_00 == pcVar1) {
        return NON_EMPTY;
      }
      sVar3 = constrain(dbm,dim,c_00);
      if (sVar3 == EMPTY) break;
      c_00 = c_00 + 1;
    }
    return EMPTY;
  }
  __assert_fail("tchecker::dbm::is_tight(dbm, dim)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,0x10a,
                "enum tchecker::dbm::status_t tchecker::dbm::constrain(tchecker::dbm::db_t *, tchecker::clock_id_t, const tchecker::clock_constraint_container_t &)"
               );
}

Assistant:

enum tchecker::dbm::status_t constrain(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim,
                                       tchecker::clock_constraint_container_t const & constraints)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  assert(tchecker::dbm::is_consistent(dbm, dim));
  assert(tchecker::dbm::is_tight(dbm, dim));

  for (tchecker::clock_constraint_t const & c : constraints) {
    if (tchecker::dbm::constrain(dbm, dim, c) == tchecker::dbm::EMPTY)
      return tchecker::dbm::EMPTY;
  }
  return tchecker::dbm::NON_EMPTY;
}